

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O1

uint32_t ivk::cmd_fopen(void *el)

{
  char *pcVar1;
  char *__filename;
  FILE *dt_00;
  uint32_t uVar2;
  char *__modes;
  char *hd;
  proc_data dt;
  char *local_68;
  proc_data local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>
  local_48;
  
  local_68 = get_attr_val((XMLElement **)el,"handle");
  pcVar1 = get_attr_val((XMLElement **)el,"mode");
  __filename = get_attr_val((XMLElement **)el,"file");
  uVar2 = 5;
  if ((__filename != (char *)0x0) && (local_68 != (char *)0x0)) {
    __modes = "wr";
    if (pcVar1 != (char *)0x0) {
      __modes = pcVar1;
    }
    dt_00 = fopen(__filename,__modes);
    proc_data::proc_data(&local_60,(char *)dt_00,8,false);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>
    ::pair<const_char_*&,_ivk::proc_data_&,_true>(&local_48,&local_68,&local_60);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ivk::proc_data>,std::_Select1st<std::pair<std::__cxx11::string_const,ivk::proc_data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ivk::proc_data>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,ivk::proc_data>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ivk::proc_data>,std::_Select1st<std::pair<std::__cxx11::string_const,ivk::proc_data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ivk::proc_data>>>
                *)gCmdMemMap_abi_cxx11_,&local_48);
    proc_data::~proc_data(&local_48.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.first._M_dataplus._M_p != &local_48.first.field_2) {
      operator_delete(local_48.first._M_dataplus._M_p);
    }
    proc_data::~proc_data(&local_60);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint32_t ivk::cmd_fopen(void* el){
    XMLElement** ep = (XMLElement**)el;
    XMLElement* e = *(XMLElement**)el;

    const char* hd = get_attr_val(ep,"handle");
    const char* md = get_attr_val(ep,"mode");
    const char* fn = get_attr_val(ep,"file");
    if(!hd || !fn){
        return proc_xml_err;
    }

    FILE* f = fopen(fn, md?md:"wr");
    proc_data dt((char*)f, sizeof(FILE*), false);
    gCmdMemMap.insert(pair<string,proc_data>(hd,dt));

    return proc_success;
}